

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderState.hpp
# Opt level: O0

void __thiscall rr::FragmentOperationState::FragmentOperationState(FragmentOperationState *this)

{
  StencilState *local_18;
  FragmentOperationState *this_local;
  
  this->scissorTestEnabled = false;
  WindowRectangle::WindowRectangle(&this->scissorRectangle,0,0,1,1);
  this->stencilTestEnabled = false;
  local_18 = this->stencilStates;
  do {
    StencilState::StencilState(local_18);
    local_18 = local_18 + 1;
  } while (local_18 != (StencilState *)&this->depthTestEnabled);
  this->depthTestEnabled = false;
  this->depthFunc = TESTFUNC_LESS;
  this->depthMask = true;
  this->blendMode = BLENDMODE_NONE;
  BlendState::BlendState(&this->blendRGBState);
  BlendState::BlendState(&this->blendAState);
  tcu::Vector<float,_4>::Vector(&this->blendColor,0.0);
  this->blendEquationAdvaced = BLENDEQUATION_ADVANCED_LAST;
  this->sRGBEnabled = true;
  this->depthClampEnabled = false;
  this->polygonOffsetEnabled = false;
  this->polygonOffsetFactor = 0.0;
  this->polygonOffsetUnits = 0.0;
  tcu::Vector<bool,_4>::Vector(&this->colorMask,true);
  this->numStencilBits = 8;
  return;
}

Assistant:

FragmentOperationState (void)
		: scissorTestEnabled	(false)
		, scissorRectangle		(0, 0, 1, 1)

		, stencilTestEnabled	(false)
		// \note stencilStates[] members get default-constructed.

		, depthTestEnabled		(false)
		, depthFunc				(TESTFUNC_LESS)
		, depthMask				(true)

		, blendMode				(BLENDMODE_NONE)
		, blendRGBState			()
		, blendAState			()
		, blendColor			(0.0f)
		, blendEquationAdvaced	(BLENDEQUATION_ADVANCED_LAST)

		, sRGBEnabled			(true)

		, depthClampEnabled		(false)

		, polygonOffsetEnabled	(false)
		, polygonOffsetFactor	(0.0f)
		, polygonOffsetUnits	(0.0f)

		, colorMask				(true)

		, numStencilBits		(8)
	{
	}